

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

string * __thiscall
toml::detail::make_string_abi_cxx11_(string *__return_storage_ptr__,detail *this,size_t len,char c)

{
  char __c;
  allocator<char> local_2d [19];
  allocator<char> local_1a;
  char local_19;
  detail *pdStack_18;
  char c_local;
  size_t len_local;
  
  __c = (char)len;
  local_19 = __c;
  pdStack_18 = this;
  len_local = (size_t)__return_storage_ptr__;
  if (this == (detail *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1a);
    std::allocator<char>::~allocator(&local_1a);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(size_type)this,__c,local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_string(std::size_t len, char c)
{
    if(len == 0) {return "";}
    return std::string(len, c);
}